

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>
::DoMarkForArguments
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>
           *this)

{
  _Map_pointer ppCVar1;
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>
  *con;
  reference con_00;
  int i;
  long __n;
  
  BasicConstraintKeeper::GetChosenAcceptanceLevelEXPR(&this->super_BasicConstraintKeeper);
  for (__n = 0; ppCVar1 = (this->cons_).
                          super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node,
      __n < (int)((int)((ulong)((long)(this->cons_).
                                      super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                               (long)(this->cons_).
                                     super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) *
                  -0x55555555 +
                 (int)((ulong)((long)(this->cons_).
                                     super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container>_>
                                     ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                              (long)(this->cons_).
                                    super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) *
                 -0x55555555 +
                 ((int)((ulong)((long)ppCVar1 -
                               (long)(this->cons_).
                                     super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
                 (uint)(ppCVar1 == (_Map_pointer)0x0)) * 5); __n = __n + 1) {
    con_00 = std::
             _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container_*>
             ::operator[](&(this->cons_).
                           super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>_>::Container>_>
                           ._M_impl.super__Deque_impl_data._M_start,__n);
    if (con_00[0x59] == (Container)0x0 && con_00[0x58] == (Container)0x0) {
      Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
      ::
      DoMarkArgsAsVars<mp::CustomStaticConstraint<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,mp::GeometricConeId>>
                ((Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
                  *)&(this->cvt_->
                     super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                     ).
                     super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                     .
                     super_Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 ,(CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::GeometricConeId>
                   *)con_00,(int)__n);
    }
  }
  return;
}

Assistant:

void DoMarkForArguments() {
    const auto eal        // expr only
        = GetChosenAcceptanceLevelEXPR();
    for (int i=0; i< (int)cons_.size(); ++i) {
      const auto& cnt = cons_[i];
      if (!cnt.IsRedundant()) {      // Delegate actual logic to Converter
        const auto& con = cnt.GetCon();
        GetConverter().ConsiderMarkingArguments(con, i, eal);
      }
    }
  }